

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O3

int ply_add_element(p_ply ply,char *name,long ninstances)

{
  size_t sVar1;
  p_ply_element __dest;
  
  if (((ply == (p_ply)0x0) || (ply->fp == (FILE *)0x0)) || (ply->io_mode != PLY_WRITE)) {
    __assert_fail("ply && ply->fp && ply->io_mode == PLY_WRITE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x1fe,"int ply_add_element(p_ply, const char *, long)");
  }
  if (((name != (char *)0x0) && (sVar1 = strlen(name), -1 < ninstances)) && (sVar1 < 0x100)) {
    __dest = ply_grow_element(ply);
    if (__dest != (p_ply_element)0x0) {
      strcpy(__dest->name,name);
      __dest->ninstances = ninstances;
    }
    return (uint)(__dest != (p_ply_element)0x0);
  }
  __assert_fail("name && strlen(name) < WORDSIZE && ninstances >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                ,0x1ff,"int ply_add_element(p_ply, const char *, long)");
}

Assistant:

int ply_add_element(p_ply ply, const char *name, long ninstances) {
    p_ply_element element = NULL;
    assert(ply && ply->fp && ply->io_mode == PLY_WRITE);
    assert(name && strlen(name) < WORDSIZE && ninstances >= 0);
    if (strlen(name) >= WORDSIZE || ninstances < 0) {
        ply_ferror(ply, "Invalid arguments");
        return 0;
    }
    element = ply_grow_element(ply);
    if (!element) return 0;
    strcpy(element->name, name);
    element->ninstances = ninstances;
    return 1;
}